

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

ReconstructState __thiscall
wasm::ReconstructStringifyWalker::getCurrState(ReconstructStringifyWalker *this)

{
  pointer pOVar1;
  ReconstructState RVar2;
  Function *pFVar3;
  ulong uVar4;
  
  uVar4 = (ulong)this->seqCounter;
  pOVar1 = (this->sequences).
           super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>.
           _M_impl.super__Vector_impl_data._M_start;
  RVar2 = NotInSeq;
  if (uVar4 < (ulong)((long)(this->sequences).
                            super__Vector_base<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 5)) {
    RVar2 = NotInSeq;
    if ((pOVar1[uVar4].startIdx <= this->instrCounter) &&
       (this->instrCounter < pOVar1[uVar4].endIdx)) {
      pFVar3 = Module::getFunction((this->super_StringifyWalker<wasm::ReconstructStringifyWalker>).
                                   super_PostWalker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                                   .
                                   super_Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                                   .currModule,(Name)pOVar1[uVar4].func.super_IString.str);
      RVar2 = InSkipSeq - (pFVar3->body == (Expression *)0x0);
    }
  }
  return RVar2;
}

Assistant:

ReconstructState getCurrState() {
    // We are either in a sequence or not in a sequence. If we are in a sequence
    // and have already created the body of the outlined function that will be
    // called, then we will skip instructions, otherwise we add the instructions
    // to the outlined function. If we are not in a sequence, then the
    // instructions are sent to the existing function.
    if (seqCounter < sequences.size() &&
        instrCounter >= sequences[seqCounter].startIdx &&
        instrCounter < sequences[seqCounter].endIdx) {
      return getModule()->getFunction(sequences[seqCounter].func)->body
               ? InSkipSeq
               : InSeq;
    }
    return NotInSeq;
  }